

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O2

Vec3f __thiscall embree::ParseStream::getVec3f(ParseStream *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  undefined4 in_XMM1_Da;
  Vec3f VVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,in_RSI);
  dVar1 = atof(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,in_RSI);
  dVar2 = atof(local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_38,in_RSI);
  dVar3 = atof(local_38._M_dataplus._M_p);
  VVar4.field_0._0_4_ = (float)dVar3;
  std::__cxx11::string::~string((string *)&local_38);
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount._vptr_RefCount = (_func_int **)CONCAT44((float)dVar2,(float)dVar1);
  *(float *)&(this->
             super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       VVar4.field_0._0_4_;
  VVar4.field_0.field_0.y = 0.0;
  VVar4.field_0.field_0.z = (float)in_XMM1_Da;
  return (Vec3f)VVar4.field_0;
}

Assistant:

Vec3f getVec3f() {
      float x = (float)atof(get().c_str());
      float y = (float)atof(get().c_str());
      float z = (float)atof(get().c_str());
      return Vec3f(x,y,z);
    }